

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  bool bVar1;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *this_00;
  pointer pTVar2;
  address64_t aVar3;
  address64_t aVar4;
  ExternalInterface *pEVar5;
  anon_class_16_2_4039898f visitor;
  Literal local_f0;
  undefined1 local_d8 [8];
  Const zero;
  Address local_80;
  Address i;
  undefined1 local_70 [8];
  Literal null;
  undefined1 local_48 [8];
  TableInstanceInfo info;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range2;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  this_00 = &this->wasm->tables;
  __end2 = std::
           vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ::begin(this_00);
  table = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
          std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                                     *)&table), bVar1) {
    info.name.super_IString.str._M_str =
         (char *)__gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                 ::operator*(&__end2);
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                       ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                        info.name.super_IString.str._M_str);
    bVar1 = wasm::Type::isNullable(&pTVar2->type);
    if (bVar1) {
      pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                          info.name.super_IString.str._M_str);
      null.type.id = (pTVar2->super_Importable).super_Named.name.super_IString.str._M_len;
      getTableInstanceInfo
                ((TableInstanceInfo *)local_48,this,
                 (Name)(pTVar2->super_Importable).super_Named.name.super_IString.str);
      pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                          info.name.super_IString.str._M_str);
      i.addr = (address64_t)wasm::Type::getHeapType(&pTVar2->type);
      wasm::Literal::makeNull((Literal *)local_70,(HeapType)i.addr);
      wasm::Address::Address(&local_80,0);
      while( true ) {
        aVar3 = wasm::Address::operator_cast_to_unsigned_long(&local_80);
        pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                           ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                            info.name.super_IString.str._M_str);
        aVar4 = wasm::Address::operator_cast_to_unsigned_long(&pTVar2->initial);
        if (aVar4 <= aVar3) break;
        pEVar5 = TableInstanceInfo::interface((TableInstanceInfo *)local_48);
        zero.value.type.id = local_80.addr;
        (*pEVar5->_vptr_ExternalInterface[0x1c])
                  (pEVar5,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                   CONCAT44(info.name.super_IString.str._M_len._4_4_,
                            (undefined4)info.name.super_IString.str._M_len),local_80.addr,local_70);
        wasm::Address::operator++(&local_80,0);
      }
      wasm::Literal::~Literal((Literal *)local_70);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
    ::operator++(&__end2);
  }
  Const::Const((Const *)local_d8);
  wasm::Literal::Literal(&local_f0,0);
  wasm::Literal::operator=
            ((Literal *)
             &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,
             &local_f0);
  wasm::Literal::~Literal(&local_f0);
  Const::finalize((Const *)local_d8);
  visitor.this = (ModuleRunnerBase<wasm::ModuleRunner> *)local_d8;
  visitor.zero = (Const *)this;
  wasm::ModuleUtils::
  iterActiveElementSegments<wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents()::_lambda(wasm::ElementSegment*)_1_>
            ((ModuleUtils *)this->wasm,(Module *)local_d8,visitor);
  Const::~Const((Const *)local_d8);
  return;
}

Assistant:

void initializeTableContents() {
    for (auto& table : wasm.tables) {
      if (table->type.isNullable()) {
        // Initial with nulls in a nullable table.
        auto info = getTableInstanceInfo(table->name);
        auto null = Literal::makeNull(table->type.getHeapType());
        for (Address i = 0; i < table->initial; i++) {
          info.interface()->tableStore(info.name, i, null);
        }
      }
    }

    Const zero;
    zero.value = Literal(uint32_t(0));
    zero.finalize();

    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      Const size;
      size.value = Literal(uint32_t(segment->data.size()));
      size.finalize();

      TableInit init;
      init.table = segment->table;
      init.segment = segment->name;
      init.dest = segment->offset;
      init.offset = &zero;
      init.size = &size;
      init.finalize();

      self()->visit(&init);

      droppedElementSegments.insert(segment->name);
    });
  }